

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O1

void __thiscall Ptex::v2_2::PtexReader::readMetaData(PtexReader *this)

{
  uint32_t uVar1;
  pointer pMVar2;
  size_t in_RAX;
  MetaData *metadata;
  _Rb_tree_header *p_Var3;
  long lVar4;
  long lVar5;
  size_t metaDataMemUsed;
  size_t local_38;
  
  local_38 = in_RAX;
  pthread_mutex_lock((pthread_mutex_t *)&this->readlock);
  if (this->_metadata == (MetaData *)0x0) {
    metadata = (MetaData *)operator_new(0x58);
    (metadata->super_PtexMetaData)._vptr_PtexMetaData = (_func_int **)&PTR__MetaData_02fa78c8;
    metadata->_reader = this;
    p_Var3 = &(metadata->_map)._M_t._M_impl.super__Rb_tree_header;
    (metadata->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (metadata->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (metadata->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    (metadata->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
    (metadata->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (metadata->_entries).
    super__Vector_base<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (metadata->_entries).
    super__Vector_base<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (metadata->_entries).
    super__Vector_base<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38 = 0x58;
    uVar1 = (this->_header).metadatamemsize;
    if (uVar1 != 0) {
      readMetaDataBlock(this,metadata,this->_metadatapos,(this->_header).metadatazipsize,uVar1,
                        &local_38);
    }
    uVar1 = (this->_extheader).lmdheadermemsize;
    if (uVar1 != 0) {
      readLargeMetaDataHeaders
                (this,metadata,this->_lmdheaderpos,(this->_extheader).lmdheaderzipsize,uVar1,
                 &local_38);
    }
    lVar5 = (long)(this->_metaedits).
                  super__Vector_base<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_metaedits).
                  super__Vector_base<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (lVar5 != 0) {
      lVar5 = lVar5 >> 4;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      lVar4 = 0xc;
      do {
        pMVar2 = (this->_metaedits).
                 super__Vector_base<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        readMetaDataBlock(this,metadata,*(FilePos *)((long)pMVar2 + lVar4 + -0xc),
                          *(int *)((long)pMVar2 + lVar4 + -4),*(int *)((long)&pMVar2->pos + lVar4),
                          &local_38);
        lVar4 = lVar4 + 0x10;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    this->_metadata = metadata;
    lVar5 = (long)(metadata->_entries).
                  super__Vector_base<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage +
            (local_38 -
            (long)(metadata->_entries).
                  super__Vector_base<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
                  ._M_impl.super__Vector_impl_data._M_start) + 0x58;
    if (lVar5 != 0) {
      LOCK();
      this->_memUsed = this->_memUsed + lVar5;
      UNLOCK();
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->readlock);
  return;
}

Assistant:

void PtexReader::readMetaData()
{
    // get read lock and make sure we still need to read
    AutoMutex locker(readlock);
    if (_metadata) {
        return;
    }

    // allocate new meta data (keep local until fully initialized)
    MetaData* newmeta = new MetaData(this);
    size_t metaDataMemUsed = sizeof(MetaData);

    // read primary meta data blocks
    if (_header.metadatamemsize)
        readMetaDataBlock(newmeta, _metadatapos,
                          _header.metadatazipsize, _header.metadatamemsize, metaDataMemUsed);

    // read large meta data headers
    if (_extheader.lmdheadermemsize)
        readLargeMetaDataHeaders(newmeta, _lmdheaderpos,
                                 _extheader.lmdheaderzipsize, _extheader.lmdheadermemsize, metaDataMemUsed);

    // read meta data edits
    for (size_t i = 0, size = _metaedits.size(); i < size; i++)
        readMetaDataBlock(newmeta, _metaedits[i].pos,
                          _metaedits[i].zipsize, _metaedits[i].memsize, metaDataMemUsed);

    // store meta data
    AtomicStore(&_metadata, newmeta);
    increaseMemUsed(newmeta->selfDataSize() + metaDataMemUsed);
}